

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

int __thiscall FNodeBuilder::CreateSeg(FNodeBuilder *this,int linenum,int sidenum)

{
  side_t *psVar1;
  uint uVar2;
  FPrivVert *pFVar3;
  int local_7c;
  side_t *sd;
  undefined1 local_60 [4];
  int segnum;
  FPrivSeg seg;
  int sidenum_local;
  int linenum_local;
  FNodeBuilder *this_local;
  
  seg.backsector._0_4_ = 0xffffffff;
  seg.nextforvert = 0;
  seg.nextforvert2 = 0xffffffff;
  seg.planenum = 0;
  seg.planefront = false;
  seg._61_3_ = 0;
  seg.storedseg._0_1_ = 0;
  seg.partner = 0xffffffff;
  seg.loopnum = -1;
  if (sidenum == 0) {
    seg._8_8_ = this->Level->Lines[linenum].frontsector;
    seg.frontsector = this->Level->Lines[linenum].backsector;
    local_60 = SUB84(this->Level->Lines[linenum].v1,0);
    segnum = (int)this->Level->Lines[linenum].v2;
  }
  else {
    seg._8_8_ = this->Level->Lines[linenum].backsector;
    seg.frontsector = this->Level->Lines[linenum].frontsector;
    segnum = (int)this->Level->Lines[linenum].v1;
    local_60 = SUB84(this->Level->Lines[linenum].v2,0);
  }
  psVar1 = this->Level->Lines[linenum].sidedef[sidenum];
  if (psVar1 == (side_t *)0x0) {
    local_7c = -1;
  }
  else {
    local_7c = (int)(((long)psVar1 - (long)sides) / 0xd8);
  }
  seg.v1 = local_7c;
  seg.v2 = linenum;
  seg.hashnext._0_4_ = sidenum;
  seg.hashnext._4_4_ = linenum;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)(int)local_60);
  seg.backsector._4_4_ = pFVar3->segs;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)segnum);
  seg.next = pFVar3->segs2;
  uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push
                    (&this->Segs,(FPrivSeg *)local_60);
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)(int)local_60);
  pFVar3->segs = uVar2;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)segnum);
  pFVar3->segs2 = uVar2;
  return uVar2;
}

Assistant:

int FNodeBuilder::CreateSeg (int linenum, int sidenum)
{
	FPrivSeg seg;
	int segnum;

	seg.next = DWORD_MAX;
	seg.loopnum = 0;
	seg.partner = DWORD_MAX;
	seg.hashnext = NULL;
	seg.planefront = false;
	seg.planenum = DWORD_MAX;
	seg.storedseg = DWORD_MAX;

	if (sidenum == 0)
	{ // front
		seg.frontsector = Level.Lines[linenum].frontsector;
		seg.backsector = Level.Lines[linenum].backsector;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v2;
	}
	else
	{ // back
		seg.frontsector = Level.Lines[linenum].backsector;
		seg.backsector = Level.Lines[linenum].frontsector;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v2;
	}
	seg.linedef = linenum;
	side_t *sd = Level.Lines[linenum].sidedef[sidenum];
	seg.sidedef = sd != NULL? int(sd - sides) : int(NO_SIDE);
	seg.nextforvert = Vertices[seg.v1].segs;
	seg.nextforvert2 = Vertices[seg.v2].segs2;

	segnum = (int)Segs.Push (seg);
	Vertices[seg.v1].segs = segnum;
	Vertices[seg.v2].segs2 = segnum;
	D(Printf(PRINT_LOG, "Seg %4d: From line %d, side %s (%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", segnum, linenum, sidenum ? "back " : "front",
		Vertices[seg.v1].x>>16, Vertices[seg.v1].y>>16, Vertices[seg.v2].x>>16, Vertices[seg.v2].y>>16,
		Vertices[seg.v1].x, Vertices[seg.v1].y, Vertices[seg.v2].x, Vertices[seg.v2].y));

	return segnum;
}